

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

LispPTR findptrsbuffer(LispPTR ptr)

{
  uint uVar1;
  uint uVar2;
  DLword *pDVar3;
  
  uVar2 = *System_Buffer_List_word;
  uVar1 = uVar2;
  while( true ) {
    if ((uVar1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    pDVar3 = Lisp_world + uVar2;
    if (((ulong)pDVar3 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar3);
    }
    if ((int)((ulong)((long)pDVar3 - (long)Lisp_world) >> 1) == 0) break;
    if (*(LispPTR *)(pDVar3 + 2) == ptr) {
      if (((ulong)pDVar3 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar3);
      }
      return (LispPTR)((ulong)((long)pDVar3 - (long)Lisp_world) >> 1);
    }
    uVar1 = *(uint *)(pDVar3 + 6);
    uVar2 = uVar1 & 0xfffffff;
  }
  return 0;
}

Assistant:

LispPTR findptrsbuffer(LispPTR ptr) {
  struct buf *bptr;
  bptr = (struct buf *)NativeAligned4FromLAddr(*System_Buffer_List_word);
  while (LAddrFromNative(bptr) != NIL) {
    if (ptr == bptr->vmempage)
      return (LAddrFromNative(bptr));
    else
      bptr = (struct buf *)NativeAligned4FromLAddr(bptr->sysnext);
  }
  return (NIL);
}